

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trust_token.cc
# Opt level: O1

TRUST_TOKEN_CLIENT * TRUST_TOKEN_CLIENT_new(TRUST_TOKEN_METHOD *method,size_t max_batchsize)

{
  TRUST_TOKEN_CLIENT *pTVar1;
  
  if (max_batchsize < 0x10000) {
    pTVar1 = (TRUST_TOKEN_CLIENT *)OPENSSL_zalloc(0xa78);
    if (pTVar1 == (TRUST_TOKEN_CLIENT *)0x0) {
      pTVar1 = (TRUST_TOKEN_CLIENT *)0x0;
    }
    else {
      pTVar1->method = method;
      pTVar1->max_batchsize = (uint16_t)max_batchsize;
    }
  }
  else {
    pTVar1 = (TRUST_TOKEN_CLIENT *)0x0;
    ERR_put_error(0x20,0,0x45,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/trust_token/trust_token.cc"
                  ,0xcc);
  }
  return pTVar1;
}

Assistant:

TRUST_TOKEN_CLIENT *TRUST_TOKEN_CLIENT_new(const TRUST_TOKEN_METHOD *method,
                                           size_t max_batchsize) {
  if (max_batchsize > 0xffff) {
    // The protocol supports only two-byte token counts.
    OPENSSL_PUT_ERROR(TRUST_TOKEN, ERR_R_OVERFLOW);
    return NULL;
  }

  TRUST_TOKEN_CLIENT *ret = reinterpret_cast<TRUST_TOKEN_CLIENT *>(
      OPENSSL_zalloc(sizeof(TRUST_TOKEN_CLIENT)));
  if (ret == NULL) {
    return NULL;
  }
  ret->method = method;
  ret->max_batchsize = (uint16_t)max_batchsize;
  return ret;
}